

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_fan_mgmt(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_power_fan_mgmt_entry *peVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = (bios->power).fan_mgmt.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar3 = (ulong)(bios->power).fan_mgmt.version;
  if ((bios->power).fan_mgmt.valid != '\0') {
    fprintf((FILE *)out,"FAN_MGMT table at 0x%x, version %x\n",(ulong)uVar1,uVar3);
    envy_bios_dump_hex(bios,out,(bios->power).fan_mgmt.offset,(uint)(bios->power).fan_mgmt.hlen,mask
                      );
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).fan_mgmt.entriesnum != '\0') {
      lVar4 = 0;
      uVar3 = 0;
      do {
        peVar2 = (bios->power).fan_mgmt.entries;
        fprintf((FILE *)out,"-- entry %i\n",uVar3 & 0xffffffff);
        fprintf((FILE *)out,anon_var_dwarf_54a5e,
                (double)*(ushort *)((long)&peVar2->temp0 + lVar4) * 0.03125,
                (ulong)(&peVar2->duty0)[lVar4],(ulong)*(ushort *)((long)&peVar2->speed0 + lVar4));
        fprintf((FILE *)out,anon_var_dwarf_54a69,
                (double)*(ushort *)((long)&peVar2->temp1 + lVar4) * 0.03125,
                (ulong)(&peVar2->duty1)[lVar4],(ulong)*(ushort *)((long)&peVar2->speed1 + lVar4));
        fprintf((FILE *)out,anon_var_dwarf_54a74,
                (double)*(ushort *)((long)&peVar2->temp2 + lVar4) * 0.03125,
                (ulong)(&peVar2->duty2)[lVar4],(ulong)*(ushort *)((long)&peVar2->speed2 + lVar4));
        envy_bios_dump_hex(bios,out,*(uint *)((long)&((bios->power).fan_mgmt.entries)->offset +
                                             lVar4),(uint)(bios->power).fan_mgmt.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar3 < (bios->power).fan_mgmt.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse FAN_MGMT table at 0x%x, version %x\n",(ulong)uVar1,uVar3);
  return;
}

Assistant:

void envy_bios_print_power_fan_mgmt(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_fan_mgmt *fan_mgmt = &bios->power.fan_mgmt;
	int i;

	if (!fan_mgmt->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!fan_mgmt->valid) {
		fprintf(out, "Failed to parse FAN_MGMT table at 0x%x, version %x\n", fan_mgmt->offset, fan_mgmt->version);
		return;
	}

	fprintf(out, "FAN_MGMT table at 0x%x, version %x\n", fan_mgmt->offset, fan_mgmt->version);
	envy_bios_dump_hex(bios, out, fan_mgmt->offset, fan_mgmt->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < fan_mgmt->entriesnum; i++) {
		struct envy_bios_power_fan_mgmt_entry *e = &fan_mgmt->entries[i];

		fprintf(out, "-- entry %i\n", i);
		fprintf(out, "\t 0: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp0 / 32, e->duty0, e->speed0);
		fprintf(out, "\t 1: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp1 / 32, e->duty1, e->speed1);
		fprintf(out, "\t 2: { %.2f °C: duty %i => %i rpm }\n", (double)e->temp2 / 32, e->duty2, e->speed2);

		envy_bios_dump_hex(bios, out, fan_mgmt->entries[i].offset, fan_mgmt->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}